

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O0

void Dar_LibSetup_rec(Dar_Lib_t *p,Dar_LibObj_t *pObj,int Class,int fCollect)

{
  int iVar1;
  int *piVar2;
  Dar_LibObj_t *pDVar3;
  int fCollect_local;
  int Class_local;
  Dar_LibObj_t *pObj_local;
  Dar_Lib_t *p_local;
  
  if ((((ulong)*pObj >> 0x23 & 1) == 0) && (SUB84(*pObj,4) >> 4 != Class)) {
    *pObj = (Dar_LibObj_t)((ulong)*pObj & 0xfffffffff | (ulong)(uint)Class << 0x24);
    pDVar3 = Dar_LibObj(p,SUB84(*pObj,0) & 0xffff);
    Dar_LibSetup_rec(p,pDVar3,Class,fCollect);
    pDVar3 = Dar_LibObj(p,SUB84(*pObj,2) & 0xffff);
    Dar_LibSetup_rec(p,pDVar3,Class,fCollect);
    if (fCollect == 0) {
      p->nNodes[Class] = p->nNodes[Class] + 1;
    }
    else {
      pDVar3 = p->pObjs;
      piVar2 = p->pNodes[Class];
      iVar1 = p->nNodes[Class];
      p->nNodes[Class] = iVar1 + 1;
      piVar2[iVar1] = (int)((long)pObj - (long)pDVar3 >> 3);
    }
  }
  return;
}

Assistant:

void Dar_LibSetup_rec( Dar_Lib_t * p, Dar_LibObj_t * pObj, int Class, int fCollect )
{
    if ( pObj->fTerm || (int)pObj->Num == Class )
        return;
    pObj->Num = Class;
    Dar_LibSetup_rec( p, Dar_LibObj(p, pObj->Fan0), Class, fCollect );
    Dar_LibSetup_rec( p, Dar_LibObj(p, pObj->Fan1), Class, fCollect );
    if ( fCollect )
        p->pNodes[Class][ p->nNodes[Class]++ ] = pObj-p->pObjs;
    else
        p->nNodes[Class]++;
}